

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTTClient.cpp
# Opt level: O0

bool __thiscall
Network::Client::RingBufferStorage::Impl::load
          (Impl *this,uint16 packetID,uint8 **packetHead,uint32 *sizeHead,uint8 **packetTail,
          uint32 *sizeTail)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  uint8 i;
  uint32 *sizeTail_local;
  uint8 **packetTail_local;
  uint32 *sizeHead_local;
  uint8 **packetHead_local;
  uint16 packetID_local;
  Impl *this_local;
  
  bVar1 = findID(this,(uint)packetID);
  bVar3 = bVar1 != this->packetsCount;
  if (bVar3) {
    *packetHead = this->buffer + *(uint *)(this->packets + (ulong)bVar1 * 0xc + 8);
    uVar2 = min<unsigned_int>(*(uint *)(this->packets + (ulong)bVar1 * 0xc + 4),
                              (this->sm1 - *(int *)(this->packets + (ulong)bVar1 * 0xc + 8)) + 1);
    *sizeHead = uVar2;
    *sizeTail = *(int *)(this->packets + (ulong)bVar1 * 0xc + 4) - *sizeHead;
    *packetTail = this->buffer;
  }
  return bVar3;
}

Assistant:

bool load(const uint16 packetID, const uint8 *& packetHead, uint32 & sizeHead, const uint8 *& packetTail,  uint32 & sizeTail)
        {
            // Look for the packet
            uint8 i = findID(packetID);
            if (i == packetsCount) return false;

            // Check if the packet is split
            packetHead = buffer + packets[i].pos;
            sizeHead = min(packets[i].size, (sm1 - packets[i].pos + 1));
            sizeTail = packets[i].size - sizeHead;
            packetTail = buffer;
            return true;
        }